

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

uint Kit_GraphToTruth(Kit_Graph_t *pGraph)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  Kit_Node_t *pKVar3;
  anon_union_8_2_00c7e208_for_Kit_Node_t__2 aVar4;
  anon_union_8_2_00c7e208_for_Kit_Node_t__2 aVar5;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_58;
  int local_54;
  int i;
  Kit_Node_t *pNode;
  uint uTruth1;
  uint uTruth0;
  uint uTruth;
  uint uTruths [5];
  Kit_Graph_t *pGraph_local;
  
  _uTruth0 = 0xccccccccaaaaaaaa;
  uTruths[0] = 0xf0f0f0f0;
  uTruths[1] = 0xff00ff00;
  uTruths[2] = 0xffff0000;
  uTruth1 = 0;
  iVar1 = Kit_GraphLeaveNum(pGraph);
  if (iVar1 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitGraph.c"
                  ,0x13a,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  iVar1 = Kit_GraphLeaveNum(pGraph);
  if (iVar1 <= pGraph->nSize) {
    iVar1 = Kit_GraphLeaveNum(pGraph);
    if (iVar1 < 6) {
      iVar1 = Kit_GraphIsConst(pGraph);
      if (iVar1 == 0) {
        iVar1 = Kit_GraphIsVar(pGraph);
        if (iVar1 == 0) {
          for (local_54 = 0; local_54 < pGraph->nLeaves; local_54 = local_54 + 1) {
            pKVar2 = Kit_GraphNode(pGraph,local_54);
            aVar4._4_4_ = 0;
            aVar4.iFunc = (&uTruth0)[local_54];
            pKVar2->field_2 = aVar4;
          }
          for (local_54 = pGraph->nLeaves; local_54 < pGraph->nSize; local_54 = local_54 + 1) {
            pKVar2 = Kit_GraphNode(pGraph,local_54);
            pKVar3 = Kit_GraphNode(pGraph,(uint)pKVar2->eEdge0 >> 1 & 0x3fffffff);
            local_60 = (pKVar3->field_2).iFunc;
            pKVar3 = Kit_GraphNode(pGraph,(uint)pKVar2->eEdge1 >> 1 & 0x3fffffff);
            local_64 = (pKVar3->field_2).iFunc;
            if (((uint)pKVar2->eEdge0 & 1) != 0) {
              local_60 = local_60 ^ 0xffffffff;
            }
            if (((uint)pKVar2->eEdge1 & 1) != 0) {
              local_64 = local_64 ^ 0xffffffff;
            }
            uTruth1 = local_60 & local_64;
            aVar5._4_4_ = 0;
            aVar5.iFunc = uTruth1;
            pKVar2->field_2 = aVar5;
          }
          iVar1 = Kit_GraphIsComplement(pGraph);
          if (iVar1 == 0) {
            local_68 = uTruth1;
          }
          else {
            local_68 = uTruth1 ^ 0xffffffff;
          }
          pGraph_local._4_4_ = local_68;
        }
        else {
          iVar1 = Kit_GraphIsComplement(pGraph);
          if (iVar1 == 0) {
            iVar1 = Kit_GraphVarInt(pGraph);
            local_58 = (&uTruth0)[iVar1];
          }
          else {
            iVar1 = Kit_GraphVarInt(pGraph);
            local_58 = (&uTruth0)[iVar1] ^ 0xffffffff;
          }
          pGraph_local._4_4_ = local_58;
        }
      }
      else {
        iVar1 = Kit_GraphIsComplement(pGraph);
        pGraph_local._4_4_ = 0xffffffff;
        if (iVar1 != 0) {
          pGraph_local._4_4_ = 0;
        }
      }
      return pGraph_local._4_4_;
    }
    __assert_fail("Kit_GraphLeaveNum(pGraph) <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitGraph.c"
                  ,0x13c,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitGraph.c"
                ,0x13b,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
}

Assistant:

unsigned Kit_GraphToTruth( Kit_Graph_t * pGraph )
{
    unsigned uTruths[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth = 0, uTruth0, uTruth1;
    Kit_Node_t * pNode;
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );
    assert( Kit_GraphLeaveNum(pGraph) <= 5 );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Kit_GraphIsComplement(pGraph)? 0 : ~((unsigned)0);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Kit_GraphIsComplement(pGraph)? ~uTruths[Kit_GraphVarInt(pGraph)] : uTruths[Kit_GraphVarInt(pGraph)];

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = (void *)(long)uTruths[i];

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        uTruth0 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc;
        uTruth1 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc;
        uTruth0 = pNode->eEdge0.fCompl? ~uTruth0 : uTruth0;
        uTruth1 = pNode->eEdge1.fCompl? ~uTruth1 : uTruth1;
        uTruth = uTruth0 & uTruth1;
        pNode->pFunc = (void *)(long)uTruth;
    }

    // complement the result if necessary
    return Kit_GraphIsComplement(pGraph)? ~uTruth : uTruth;
}